

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow-c.cpp
# Opt level: O0

duckdb_state duckdb_query_arrow(duckdb_connection connection,char *query,duckdb_arrow *out_result)

{
  bool bVar1;
  unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
  *puVar2;
  pointer this;
  undefined8 *in_RDX;
  char *in_RSI;
  unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
  *in_RDI;
  ArrowResultWrapper *wrapper;
  Connection *conn;
  unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
  *puVar3;
  ArrowResultWrapper *in_stack_ffffffffffffff80;
  allocator local_51;
  string *in_stack_ffffffffffffffb0;
  Connection *in_stack_ffffffffffffffb8;
  
  puVar2 = (unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
            *)operator_new(0x10);
  (puVar2->
  super_unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>_>
  )._M_t.
  super___uniq_ptr_impl<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::MaterializedQueryResult_*,_std::default_delete<duckdb::MaterializedQueryResult>_>
  .super__Head_base<0UL,_duckdb::MaterializedQueryResult_*,_false>._M_head_impl =
       (MaterializedQueryResult *)0x0;
  puVar2[1].
  super_unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::MaterializedQueryResult_*,_std::default_delete<duckdb::MaterializedQueryResult>_>
  .super__Head_base<0UL,_duckdb::MaterializedQueryResult_*,_false>._M_head_impl =
       (MaterializedQueryResult *)0x0;
  duckdb::ArrowResultWrapper::ArrowResultWrapper(in_stack_ffffffffffffff80);
  puVar3 = puVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&stack0xffffffffffffffb0,in_RSI,&local_51);
  duckdb::Connection::Query(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  duckdb::
  unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
  ::operator=(in_RDI,puVar3);
  duckdb::
  unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
  ::~unique_ptr((unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                 *)0x1909193);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffb0);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  *in_RDX = puVar2;
  this = duckdb::
         unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
         ::operator->(in_RDI);
  bVar1 = duckdb::BaseQueryResult::HasError((BaseQueryResult *)this);
  return (uint)(((bVar1 ^ 0xffU) & 1) == 0);
}

Assistant:

duckdb_state duckdb_query_arrow(duckdb_connection connection, const char *query, duckdb_arrow *out_result) {
	Connection *conn = (Connection *)connection;
	auto wrapper = new ArrowResultWrapper();
	wrapper->result = conn->Query(query);
	*out_result = (duckdb_arrow)wrapper;
	return !wrapper->result->HasError() ? DuckDBSuccess : DuckDBError;
}